

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotBarsHEx<ImPlot::GetterBarH<double>,double>
               (char *label_id,GetterBarH<double> *getter,double height)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  double *pdVar7;
  ImPlotPlot *pIVar8;
  ImPlotContext *pIVar9;
  bool bVar10;
  ImU32 col;
  ImU32 col_00;
  ImDrawList *this;
  int iVar11;
  int iVar12;
  ImPlotRange *pIVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar10 = BeginItem(label_id,1);
  pIVar9 = GImPlot;
  if (bVar10) {
    dVar21 = height * 0.5;
    if ((GImPlot->FitThisFrame == true) && (iVar11 = getter->Count, 0 < iVar11)) {
      pdVar7 = getter->Xs;
      iVar12 = getter->Offset;
      iVar3 = getter->Stride;
      dVar1 = getter->YShift;
      pIVar8 = GImPlot->CurrentPlot;
      iVar4 = pIVar8->CurrentYAxis;
      uVar5 = (pIVar8->XAxis).Flags;
      pIVar13 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar8->YAxis[iVar4].Flags;
      iVar14 = 0;
      dVar15 = 0.0;
      do {
        dVar17 = *(double *)
                  ((long)pdVar7 +
                  (long)(((iVar12 + iVar14) % iVar11 + iVar11) % iVar11) * (long)iVar3);
        dVar16 = dVar1 + dVar15;
        dVar18 = dVar16 - dVar21;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((uVar5 & 0x20) == 0) {
LAB_001fb265:
            dVar19 = (pIVar9->ExtentsX).Min;
            dVar20 = 0.0;
            if (dVar19 <= 0.0) {
              dVar20 = dVar19;
            }
            (pIVar9->ExtentsX).Min = dVar20;
            dVar19 = (pIVar9->ExtentsX).Max;
            dVar20 = 0.0;
            if (0.0 <= dVar19) {
              dVar20 = dVar19;
            }
            (pIVar9->ExtentsX).Max = dVar20;
          }
        }
        else if ((((uVar5 & 0x20) == 0) && (pIVar8->YAxis[iVar4].Range.Min <= dVar18)) &&
                (dVar18 <= pIVar8->YAxis[iVar4].Range.Max)) goto LAB_001fb265;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar18) < 0x7ff0000000000000) {
LAB_001fb2ca:
            if ((0.0 < dVar18) || ((uVar6 & 0x20) == 0)) {
              dVar19 = dVar18;
              if (pIVar13->Min <= dVar18) {
                dVar19 = pIVar13->Min;
              }
              pIVar13->Min = dVar19;
              dVar19 = pIVar9->ExtentsY[iVar4].Max;
              if (dVar18 <= dVar19) {
                dVar18 = dVar19;
              }
              pIVar9->ExtentsY[iVar4].Max = dVar18;
            }
          }
        }
        else if ((((long)ABS(dVar18) < 0x7ff0000000000000) && ((pIVar8->XAxis).Range.Min <= 0.0)) &&
                (0.0 <= (pIVar8->XAxis).Range.Max)) goto LAB_001fb2ca;
        dVar16 = dVar16 + dVar21;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar17) < 0x7ff0000000000000) {
LAB_001fb32c:
            if ((0.0 < dVar17) || ((uVar5 & 0x20) == 0)) {
              dVar18 = (pIVar9->ExtentsX).Min;
              dVar19 = dVar17;
              if (dVar18 <= dVar17) {
                dVar19 = dVar18;
              }
              (pIVar9->ExtentsX).Min = dVar19;
              dVar18 = (pIVar9->ExtentsX).Max;
              dVar19 = dVar17;
              if (dVar17 <= dVar18) {
                dVar19 = dVar18;
              }
              (pIVar9->ExtentsX).Max = dVar19;
            }
          }
        }
        else if ((((ulong)ABS(dVar17) < 0x7ff0000000000000) &&
                 (pIVar8->YAxis[iVar4].Range.Min <= dVar16)) &&
                (dVar16 <= pIVar8->YAxis[iVar4].Range.Max)) goto LAB_001fb32c;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar16) < 0x7ff0000000000000) {
LAB_001fb39e:
            if ((0.0 < dVar16) || ((uVar6 & 0x20) == 0)) {
              dVar17 = dVar16;
              if (pIVar13->Min <= dVar16) {
                dVar17 = pIVar13->Min;
              }
              pIVar13->Min = dVar17;
              dVar17 = pIVar9->ExtentsY[iVar4].Max;
              if (dVar16 <= dVar17) {
                dVar16 = dVar17;
              }
              pIVar9->ExtentsY[iVar4].Max = dVar16;
            }
          }
        }
        else if ((((long)ABS(dVar16) < 0x7ff0000000000000) && ((pIVar8->XAxis).Range.Min <= dVar17))
                && (dVar17 <= (pIVar8->XAxis).Range.Max)) goto LAB_001fb39e;
        dVar15 = dVar15 + 1.0;
        iVar14 = iVar14 + 1;
      } while (iVar11 != iVar14);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar9->NextItemData).Colors);
    col_00 = ImGui::GetColorU32((pIVar9->NextItemData).Colors + 1);
    iVar11 = getter->Count;
    if (0 < iVar11) {
      bVar10 = (pIVar9->NextItemData).RenderFill;
      bVar2 = (pIVar9->NextItemData).RenderLine;
      iVar12 = 0;
      do {
        dVar1 = *(double *)
                 ((long)getter->Xs +
                 (long)(((getter->Offset + iVar12) % iVar11 + iVar11) % iVar11) *
                 (long)getter->Stride);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar15 = (double)iVar12 + getter->YShift;
          local_38 = PlotToPixels(0.0,dVar15 - dVar21,-1);
          local_40 = PlotToPixels(dVar1,dVar15 + dVar21,-1);
          if ((pIVar9->NextItemData).RenderFill == true) {
            ImDrawList::AddRectFilled(this,&local_38,&local_40,col_00,0.0,0);
          }
          if (((bVar10 ^ 1U | col != col_00) & bVar2) != 0) {
            ImDrawList::AddRect(this,&local_38,&local_40,col,0.0,0xf0,
                                (pIVar9->NextItemData).LineWeight);
          }
        }
        iVar12 = iVar12 + 1;
        iVar11 = getter->Count;
      } while (iVar12 < iVar11);
    }
    pIVar9 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar9->NextItemData);
    pIVar9->PreviousItem = pIVar9->CurrentItem;
    pIVar9->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}